

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O1

int expand_pos_expression(dmr_C *C,expression *expr)

{
  int iVar1;
  position pVar2;
  allocator *paVar3;
  expression *peVar4;
  expression *peVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  expression *peVar9;
  expression_list *ptr;
  expression_list *peVar10;
  undefined1 local_60 [8];
  ptr_list_iter entryiter__;
  
  ptr = (expr->field_5).field_11.args;
  peVar10 = ptr;
  if ((expr->field_5).field_15.idx_to == 1) {
    iVar8 = (expr->field_5).field_2.wide;
    if (*(char *)ptr == '\x18') {
      uVar6 = *(undefined4 *)&ptr->field_0x0;
      uVar7 = *(undefined4 *)&ptr->field_0x4;
      pVar2 = (position)ptr->prev_;
      peVar10 = ptr->next_;
      paVar3 = ptr->allocator_;
      peVar9 = ptr->list_[0];
      peVar4 = ptr->list_[1];
      peVar5 = ptr->list_[3];
      (expr->field_5).field_10.cond_false = ptr->list_[2];
      (expr->field_5).field_14.ident_expression = peVar5;
      (expr->field_5).field_0.value = (unsigned_long_long)peVar9;
      (expr->field_5).field_2.string = (string *)peVar4;
      expr->ctype = (symbol *)peVar10;
      *(allocator **)&expr->field_0x18 = paVar3;
      *(undefined4 *)&expr->field_0x0 = uVar6;
      expr->op = uVar7;
      expr->pos = pVar2;
      ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)(expr->field_5).field_3.unop);
      peVar9 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_60);
      peVar10 = (expression_list *)expr;
      if (peVar9 != (expression *)0x0) {
        entryiter__._16_8_ = &C->expression_allocator;
        do {
          if (*(char *)peVar9 == '\x1b') {
            (peVar9->field_5).field_2.wide = (peVar9->field_5).field_2.wide + iVar8;
          }
          else {
            if (ptr == (expression_list *)0x0) {
              pVar2 = peVar9->pos;
              ptr = (expression_list *)dmrC_allocator_allocate((allocator *)entryiter__._16_8_,0);
              *(char *)ptr = '\x1b';
              ptr->prev_ = (expression_list *)pVar2;
            }
            *(char *)ptr = '\x1b';
            ptr->next_ = (expression_list *)peVar9->ctype;
            *(int *)ptr->list_ = iVar8;
            *(undefined4 *)((long)ptr->list_ + 4) = 1;
            ptr->list_[1] = peVar9;
            ptrlist_iter_set((ptr_list_iter *)local_60,ptr);
            ptr = (expression_list *)0x0;
          }
          peVar9 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_60);
        } while (peVar9 != (expression *)0x0);
      }
    }
    else if (*(char *)ptr == '\x1b') {
      iVar1 = *(int *)ptr->list_;
      uVar6 = *(undefined4 *)&ptr->field_0x0;
      uVar7 = *(undefined4 *)&ptr->field_0x4;
      pVar2 = (position)ptr->prev_;
      peVar10 = ptr->next_;
      paVar3 = ptr->allocator_;
      peVar9 = ptr->list_[1];
      peVar4 = ptr->list_[2];
      peVar5 = ptr->list_[3];
      (expr->field_5).field_0.value = (unsigned_long_long)ptr->list_[0];
      (expr->field_5).field_2.string = (string *)peVar9;
      (expr->field_5).field_10.cond_false = peVar4;
      (expr->field_5).field_14.ident_expression = peVar5;
      expr->ctype = (symbol *)peVar10;
      *(allocator **)&expr->field_0x18 = paVar3;
      *(undefined4 *)&expr->field_0x0 = uVar6;
      expr->op = uVar7;
      expr->pos = pVar2;
      (expr->field_5).field_2.wide = iVar8 + iVar1;
      peVar10 = (expression_list *)expr;
    }
  }
  iVar8 = expand_expression(C,(expression *)peVar10);
  return iVar8;
}

Assistant:

static int expand_pos_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression *nested = expr->init_expr;
	unsigned long offset = expr->init_offset;
	int nr = expr->init_nr;

	if (nr == 1) {
		switch (nested->type) {
		case EXPR_POS:
			offset += nested->init_offset;
			*expr = *nested;
			expr->init_offset = offset;
			nested = expr;
			break;

		case EXPR_INITIALIZER: {
			struct expression *reuse = nested, *entry;
			*expr = *nested;
			FOR_EACH_PTR(expr->expr_list, entry) {
				if (entry->type == EXPR_POS) {
					entry->init_offset += offset;
				} else {
					if (!reuse) {
						/*
						 * This happens rarely, but it can happen
						 * with bitfields that are all at offset
						 * zero..
						 */
						reuse = dmrC_alloc_expression(C, entry->pos, EXPR_POS);
					}
					reuse->type = EXPR_POS;
					reuse->ctype = entry->ctype;
					reuse->init_offset = offset;
					reuse->init_nr = 1;
					reuse->init_expr = entry;
					REPLACE_CURRENT_PTR(struct expression *, entry, reuse);
					reuse = NULL;
				}
			} END_FOR_EACH_PTR(entry);
			nested = expr;
			break;
		}

		default:
			break;
		}
	}
	return expand_expression(C, nested);
}